

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

tcflag_t * tty__get_flag(termios *t,wchar_t kind)

{
  switch(kind) {
  case L'\0':
    break;
  case L'\x01':
    t = (termios *)&t->c_oflag;
    break;
  case L'\x02':
    t = (termios *)&t->c_cflag;
    break;
  case L'\x03':
    t = (termios *)&t->c_lflag;
    break;
  default:
    abort();
  }
  return &t->c_iflag;
}

Assistant:

static tcflag_t *
tty__get_flag(struct termios *t, int kind) {
	switch (kind) {
	case MD_INP:
		return &t->c_iflag;
	case MD_OUT:
		return &t->c_oflag;
	case MD_CTL:
		return &t->c_cflag;
	case MD_LIN:
		return &t->c_lflag;
	default:
		abort();
		/*NOTREACHED*/
	}
}